

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cpp
# Opt level: O2

bool __thiscall pg::RTLSolver::rtl(RTLSolver *this,bitset *SG,int only_player,int depth)

{
  bitset *this_00;
  bitset *Z_00;
  bitset *this_01;
  bitset *R_00;
  ulong *puVar1;
  uint maxpr;
  int iVar2;
  int iVar3;
  Game *pGVar4;
  uint *puVar5;
  uint64_t *puVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  ulong pos;
  ostream *poVar10;
  size_t sVar11;
  int *piVar12;
  Error *this_02;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  uint pl;
  bool bVar19;
  bool local_b0;
  _label_vertex local_a0;
  bitset Z;
  bitset R;
  
  bitset::bitset(&R,SG);
  bitset::bitset(&Z,((this->super_Solver).game)->n_vertices);
  pos = bitset::find_last(&R);
  this_00 = &this->V;
  Z_00 = &this->W;
  local_b0 = false;
  this_01 = &this->S;
  R_00 = &this->G;
LAB_0015e832:
  do {
    if (pos == 0xffffffffffffffff) {
LAB_0015f089:
      bitset::~bitset(&Z);
      bitset::~bitset(&R);
      return local_b0;
    }
    maxpr = ((this->super_Solver).game)->_priority[(int)pos];
    pl = maxpr & 1;
    if ((only_player == -1) || (pl == only_player)) {
      for (; pos != 0xffffffffffffffff; pos = bitset::find_prev(&R,pos)) {
        uVar8 = (uint)pos;
        if (((((this->super_Solver).game)->_priority[(int)uVar8] ^ maxpr) & 1) != 0) break;
        if (1 < (this->super_Solver).trace) {
          poVar10 = std::operator<<((this->super_Solver).logger,"\x1b[1;37mattracting to \x1b[36m");
          local_a0.g = (this->super_Solver).game;
          local_a0.v = uVar8;
          poVar10 = operator<<(poVar10,&local_a0);
          poVar10 = std::operator<<(poVar10,"\x1b[m for \x1b[1;36m");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,pl);
          poVar10 = std::operator<<(poVar10,"\x1b[m");
          poVar10 = std::operator<<(poVar10," (pr: ");
          poVar10 = (ostream *)
                    std::ostream::operator<<
                              (poVar10,((this->super_Solver).game)->_priority[(int)uVar8]);
          poVar10 = std::operator<<(poVar10,")");
          std::endl<char,std::char_traits<char>>(poVar10);
        }
        uVar15 = 1L << (pos & 0x3f);
        puVar1 = (this->V)._bits + (pos >> 6);
        *puVar1 = *puVar1 | uVar15;
        Z._bits[pos >> 6] = Z._bits[pos >> 6] | uVar15;
        this->str[pos] = -1;
        iVar2 = (this->Q).pointer;
        (this->Q).pointer = iVar2 + 1;
        (this->Q).queue[iVar2] = uVar8;
        while( true ) {
          iVar2 = (this->Q).pointer;
          if ((long)iVar2 == 0) break;
          (this->Q).pointer = iVar2 + -1;
          uVar8 = (this->Q).queue[(long)iVar2 + -1];
          bVar7 = (byte)uVar8 & 0x3f;
          R._bits[(ulong)(long)(int)uVar8 >> 6] =
               R._bits[(ulong)(long)(int)uVar8 >> 6] &
               (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
          attractVertices(this,pl,uVar8,&R,&Z,&R,maxpr);
          attractTangles(this,pl,uVar8,&R,&Z,&R,maxpr);
        }
      }
      if (1 < (this->super_Solver).trace) {
        std::operator<<((this->super_Solver).logger,"\x1b[1;33mregion\x1b[m ");
        uVar18 = ~(depth >> 0x1f) & depth;
        while( true ) {
          poVar10 = (this->super_Solver).logger;
          bVar19 = uVar18 == 0;
          uVar18 = uVar18 - 1;
          if (bVar19) break;
          std::operator<<(poVar10,"*");
        }
        poVar10 = std::operator<<(poVar10,"\x1b[1;36m");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,maxpr);
        std::operator<<(poVar10,"\x1b[m");
        for (sVar11 = bitset::find_last(&Z); poVar10 = (this->super_Solver).logger,
            sVar11 != 0xffffffffffffffff; sVar11 = bitset::find_prev(&Z,sVar11)) {
          poVar10 = std::operator<<(poVar10," \x1b[1;38;5;15m");
          local_a0.g = (this->super_Solver).game;
          local_a0.v = (int)sVar11;
          poVar10 = operator<<(poVar10,&local_a0);
          std::operator<<(poVar10,"\x1b[m");
          if (this->str[sVar11] != -1) {
            poVar10 = std::operator<<((this->super_Solver).logger,"->");
            local_a0.g = (this->super_Solver).game;
            local_a0.v = this->str[sVar11];
            operator<<(poVar10,&local_a0);
          }
        }
        std::endl<char,std::char_traits<char>>(poVar10);
      }
      if (only_player == -1 && pos == 0xffffffffffffffff) {
LAB_0015eca4:
        puVar5 = this->pea_vidx;
        lVar17 = ((this->super_Solver).game)->n_vertices;
        for (lVar16 = 0; lVar17 << 2 != lVar16; lVar16 = lVar16 + 4) {
          *(undefined4 *)((long)puVar5 + lVar16) = 0;
        }
        this->pea_curidx = 1;
        iVar2 = this->dominions;
        for (uVar15 = bitset::find_last(this_00); uVar15 != 0xffffffffffffffff;
            uVar15 = bitset::find_prev(this_00,uVar15)) {
          if ((Z._bits[uVar15 >> 6] >> (uVar15 & 0x3f) & 1) == 0) {
            this_02 = (Error *)__cxa_allocate_exception(0x40);
            Error::Error(this_02,"logic error",
                         "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/rtl.cpp"
                         ,0x203);
            __cxa_throw(this_02,&Error::typeinfo,Error::~Error);
          }
          bVar19 = extractTangles(this,(int)uVar15,&Z);
          local_b0 = (bool)(local_b0 | bVar19);
        }
        iVar9 = this->dominions;
        if (iVar2 == iVar9) {
          for (uVar15 = bitset::find_last(this_00); uVar15 != 0xffffffffffffffff;
              uVar15 = bitset::find_prev(this_00,uVar15)) {
            uVar13 = uVar15 >> 6;
            if ((Z._bits[uVar13] >> (uVar15 & 0x3f) & 1) != 0) {
              if (1 < (this->super_Solver).trace) {
                poVar10 = std::operator<<((this->super_Solver).logger,
                                          "\x1b[1;37mattracting to top vertex \x1b[36m");
                local_a0.g = (this->super_Solver).game;
                local_a0.v = (uint)uVar15;
                poVar10 = operator<<(poVar10,&local_a0);
                poVar10 = std::operator<<(poVar10,"\x1b[m");
                std::endl<char,std::char_traits<char>>(poVar10);
              }
              uVar14 = 1L << (uVar15 & 0x3f);
              puVar1 = (this->W)._bits + uVar13;
              *puVar1 = *puVar1 | uVar14;
              Z._bits[uVar13] = Z._bits[uVar13] & ~uVar14;
              iVar3 = (this->Q).pointer;
              (this->Q).pointer = iVar3 + 1;
              (this->Q).queue[iVar3] = (uint)uVar15;
              break;
            }
          }
          while( true ) {
            iVar3 = (this->Q).pointer;
            if ((long)iVar3 == 0) break;
            (this->Q).pointer = iVar3 + -1;
            uVar8 = (this->Q).queue[(long)iVar3 + -1];
            bVar7 = (byte)uVar8 & 0x3f;
            Z._bits[(ulong)(long)(int)uVar8 >> 6] =
                 Z._bits[(ulong)(long)(int)uVar8 >> 6] &
                 (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
            attractVertices(this,pl ^ 1,uVar8,&Z,Z_00,&Z,maxpr);
            attractTangles(this,pl ^ 1,uVar8,&Z,Z_00,&Z,maxpr);
          }
        }
        else {
          for (sVar11 = bitset::find_first(this_01); sVar11 != 0xffffffffffffffff;
              sVar11 = bitset::find_next(this_01,sVar11)) {
            iVar3 = (this->Q).pointer;
            (this->Q).pointer = iVar3 + 1;
            (this->Q).queue[iVar3] = (uint)sVar11;
          }
          while( true ) {
            iVar3 = (this->Q).pointer;
            if ((long)iVar3 == 0) break;
            (this->Q).pointer = iVar3 + -1;
            uVar8 = (this->Q).queue[(long)iVar3 + -1];
            attractVertices(this,pl,uVar8,R_00,this_01,R_00,0x7fffffff);
            attractTangles(this,pl,uVar8,R_00,this_01,R_00,0x7fffffff);
          }
          for (sVar11 = bitset::find_first(this_01); sVar11 != 0xffffffffffffffff;
              sVar11 = bitset::find_next(this_01,sVar11)) {
            Solver::solve(&this->super_Solver,(int)sVar11,pl,this->str[sVar11]);
          }
          bitset::operator-=(R_00,this_01);
          sVar11 = (this->S)._bitssize;
          puVar6 = (this->S)._bits;
          for (lVar17 = 0; sVar11 << 3 != lVar17; lVar17 = lVar17 + 8) {
            *(undefined8 *)((long)puVar6 + lVar17) = 0;
          }
          sVar11 = (this->V)._bitssize;
          puVar6 = (this->V)._bits;
          for (lVar17 = 0; sVar11 << 3 != lVar17; lVar17 = lVar17 + 8) {
            *(undefined8 *)((long)puVar6 + lVar17) = 0;
          }
        }
        if (iVar2 == iVar9) goto LAB_0015efc9;
LAB_0015f0b7:
        local_b0 = true;
        goto LAB_0015f089;
      }
      for (uVar15 = bitset::find_last(this_00); uVar15 != 0xffffffffffffffff;
          uVar15 = bitset::find_prev(this_00,uVar15)) {
        uVar8 = (uint)uVar15;
        uVar18 = Solver::owner(&this->super_Solver,uVar8);
        if (uVar18 == pl) {
          if (this->str[uVar15] == -1) goto LAB_0015ebb0;
        }
        else {
          pGVar4 = (this->super_Solver).game;
          piVar12 = pGVar4->_outedges + pGVar4->_firstouts[(int)uVar8];
          do {
            uVar13 = (ulong)*piVar12;
            if (uVar13 == 0xffffffffffffffff) goto LAB_0015ebf5;
            piVar12 = piVar12 + 1;
          } while ((R._bits[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) == 0);
LAB_0015ebb0:
          uVar13 = 1L << (uVar15 & 0x3f);
          Z_00->_bits[uVar15 >> 6] = Z_00->_bits[uVar15 >> 6] | uVar13;
          Z._bits[uVar15 >> 6] = Z._bits[uVar15 >> 6] & ~uVar13;
          iVar2 = (this->Q).pointer;
          (this->Q).pointer = iVar2 + 1;
          (this->Q).queue[iVar2] = uVar8;
        }
LAB_0015ebf5:
      }
      iVar2 = (this->Q).pointer;
      iVar9 = iVar2;
      while (iVar9 != 0) {
        (this->Q).pointer = iVar9 + -1;
        uVar8 = (this->Q).queue[(long)iVar9 + -1];
        bVar7 = (byte)uVar8 & 0x3f;
        Z._bits[(ulong)(long)(int)uVar8 >> 6] =
             Z._bits[(ulong)(long)(int)uVar8 >> 6] &
             (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
        attractVertices(this,pl ^ 1,uVar8,&Z,Z_00,&Z,maxpr);
        attractTangles(this,pl ^ 1,uVar8,&Z,Z_00,&Z,maxpr);
        iVar9 = (this->Q).pointer;
      }
      if (iVar2 == 0) goto LAB_0015eca4;
LAB_0015efc9:
      sVar11 = (this->V)._bitssize;
      puVar6 = (this->V)._bits;
      for (lVar17 = 0; sVar11 << 3 != lVar17; lVar17 = lVar17 + 8) {
        *(undefined8 *)((long)puVar6 + lVar17) = 0;
      }
      sVar11 = (this->W)._bitssize;
      puVar6 = (this->W)._bits;
      for (lVar17 = 0; sVar11 << 3 != lVar17; lVar17 = lVar17 + 8) {
        *(undefined8 *)((long)puVar6 + lVar17) = 0;
      }
      bVar19 = bitset::any(&Z);
      if (bVar19) {
        iVar2 = this->dominions;
        bVar19 = rtl(this,&Z,only_player,depth + 1);
        if (iVar2 != this->dominions) goto LAB_0015f0b7;
        local_b0 = (bool)(local_b0 | bVar19);
      }
      for (lVar17 = 0; Z._bitssize << 3 != lVar17; lVar17 = lVar17 + 8) {
        *(undefined8 *)((long)Z._bits + lVar17) = 0;
      }
      goto LAB_0015e832;
    }
    pos = bitset::find_prev(&R,pos);
  } while( true );
}

Assistant:

bool
RTLSolver::rtl(bitset &SG, int only_player, int depth)
{
    bitset R(SG); // make a local copy of SG
    bitset Z(nodecount());

    bool new_tangles = false;

    auto top = R.find_last();

    while (top != bitset::npos) {
        const int pr = priority(top);
        const int pl = priority(top)&1;

        if (only_player != -1 && only_player != pl) {
            // oh. 
            top = R.find_prev(top);
            continue;
        }
            
        // attract from all heads with priority <pr> that are in <R>
        for (; top != bitset::npos; top = R.find_prev(top)) {
            if ((priority(top)&1) != (pr&1)) break; // otf compress
            // if (priority(top) != pr) break; // disable otf compress

#ifndef NDEBUG
            if (trace >= 2) {
                logger << "\033[1;37mattracting to \033[36m" << label_vertex(top) << "\033[m for \033[1;36m" << pl << "\033[m" << " (pr: " << priority(top) << ")" << std::endl;
            }
#endif

            V[top] = true; // heads
            Z[top] = true; // add to <Z>
            str[top] = -1;
            Q.push(top);

            while (Q.nonempty()) {
                const int v = Q.pop();
                R[v] = false; // remove from <R>
                attractVertices(pl, v, R, Z, R, pr);
                attractTangles(pl, v, R, Z, R, pr);
            }
        }

#ifndef NDEBUG
        if (trace >= 2) {
            // report region
            logger << "\033[1;33mregion\033[m ";
            for (int i=0; i<depth; i++) logger << "*";
            logger << "\033[1;36m" << pr << "\033[m";
            for (auto v = Z.find_last(); v != bitset::npos; v = Z.find_prev(v)) {
                logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
                if (str[v] != -1) logger << "->" << label_vertex(str[v]);
            }
            logger << std::endl;
        }
#endif

        bool leaks = false;

        if (!(only_player == -1 and top == bitset::npos)) { // if not lowest region
            // figure out what are good heads.
            for (auto v = V.find_last(); v != bitset::npos; v = V.find_prev(v)) {
                // check if open
                if (owner(v) == pl) {
                    if (str[v] == -1) {
                        W[v] = true;
                        Z[v] = false;
                        Q.push(v);
                    }
                } else {
                    for (auto curedge = outs(v); *curedge != -1; curedge++) {
                        if (R[*curedge]) {
                            W[v] = true;
                            Z[v] = false;
                            Q.push(v);
                            break;
                        }
                    }
                }
            }

            leaks = Q.nonempty();

            while (Q.nonempty()) {
                const int v = Q.pop();
                Z[v] = false; // remove from <Z>
                attractVertices(1-pl, v, Z, W, Z, pr);
                attractTangles(1-pl, v, Z, W, Z, pr);
            }
        }

        if (!leaks) {
            /**
             * Extract tangles by computing bottom SCCs starting at each top vertex.
             * Note: each bottom SCC must contain a top vertex.
             */

            std::fill(pea_vidx, pea_vidx+nodecount(), '\0');
            pea_curidx = 1;

            const auto D = dominions;
            for (auto v = V.find_last(); v != bitset::npos; v = V.find_prev(v)) {
                if (!Z[v]) LOGIC_ERROR;
                if (extractTangles(v, Z)) new_tangles = true;
            }

            // Extend any dominions that were found.
            // (Any solved vertices are now in <S>.)
            if (D != dominions) {
                for (auto v = S.find_first(); v != bitset::npos; v = S.find_next(v)) Q.push(v);

                while (Q.nonempty()) {
                    const int v = Q.pop();
                    attractVertices(pl, v, G, S, G, INT_MAX);
                    attractTangles(pl, v, G, S, G, INT_MAX);
                }

                for (auto v = S.find_first(); v != bitset::npos; v = S.find_next(v)) {
                    Solver::solve(v, pl, str[v]);
                }

                G -= S; // remove from G
                S.reset();
                V.reset();
                return true; // end tl so that we can restart...
            }

            // now if we want to recursively decompose closed regions,
            // we need to remove some top part of the region.
            // the fact that we attract to multiple tops makes this a bit awkward, though.
            // TODO: a better method might be to simply check all newly learned tangles, and
            // then avoid the top vertices of those new tangles?
            if (RECURSIVE_CLOSED_REGIONS) {
                for (auto v = V.find_last(); v != bitset::npos; v = V.find_prev(v)) {
                    if (Z[v]) {
                        if (trace >= 2) {
                            logger << "\033[1;37mattracting to top vertex \033[36m" << label_vertex(v) << "\033[m" << std::endl;
                        }
                        W[v] = true;
                        Z[v] = false;
                        Q.push(v);
                        break; // only pick one highest-priority vertex to avoid
                    }
                }

                while (Q.nonempty()) {
                    const int v = Q.pop();
                    Z[v] = false; // remove from <Z>
                    attractVertices(1-pl, v, Z, W, Z, pr);
                    attractTangles(1-pl, v, Z, W, Z, pr);
                }
            }
        }

        if (RECURSIVE_CLOSED_REGIONS || leaks) {
            V.reset();
            W.reset();

            if (Z.any()) {
                const auto D = dominions;
                if (rtl(Z, only_player, depth+1)) {
                    new_tangles = true;
                }
                if (D != dominions) return true; // full restart
            }
        } else {
            V.reset();
        }

        Z.reset();
    }

    return new_tangles;
}